

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

void __thiscall TLaplaceExample1::TLaplaceExample1(TLaplaceExample1 *this,TLaplaceExample1 *cp)

{
  (this->super_TPZAnalyticSolution)._vptr_TPZAnalyticSolution =
       (_func_int **)&PTR__TPZAnalyticSolution_019e0f20;
  (this->super_TPZAnalyticSolution).fSignConvention =
       (cp->super_TPZAnalyticSolution).fSignConvention;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "TPZAnalyticSolution::TPZAnalyticSolution(const TPZAnalyticSolution &cp): One should not invoke this copy constructor"
             ,0x74);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
             ,0xa6);
}

Assistant:

TLaplaceExample1::TLaplaceExample1(const TLaplaceExample1 &cp) : TPZAnalyticSolution(cp),fExact(cp.fExact) {
    std::cout << "TLaplaceExample1::TLaplaceExample1(const TLaplaceExample1 &cp): One should not invoke this copy constructor";
    DebugStop();
}